

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall gulps::gulps_output::add_filter(gulps_output *this,filter_fun filter)

{
  pointer *ppp_Var1;
  iterator __position;
  filter_fun local_8;
  
  __position._M_current =
       (this->filters).
       super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->filters).
      super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = filter;
    std::vector<bool(*)(gulps::message_const&),std::allocator<bool(*)(gulps::message_const&)>>::
    _M_realloc_insert<bool(*const&)(gulps::message_const&)>
              ((vector<bool(*)(gulps::message_const&),std::allocator<bool(*)(gulps::message_const&)>>
                *)&this->filters,__position,&local_8);
  }
  else {
    *__position._M_current = filter;
    ppp_Var1 = &(this->filters).
                super__Vector_base<bool_(*)(const_gulps::message_&),_std::allocator<bool_(*)(const_gulps::message_&)>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppp_Var1 = *ppp_Var1 + 1;
  }
  return;
}

Assistant:

void add_filter(filter_fun filter) { filters.push_back(filter); }